

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax.cpp
# Opt level: O2

unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_> __thiscall
pfederc::Parser::parsePrimary
          (Parser *this,
          unique_ptr<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_> *caps)

{
  Token *pTVar1;
  bool bVar2;
  undefined1 local_30 [8];
  Token *tok;
  
  pTVar1 = *(Token **)
            ((long)&(caps->_M_t).
                    super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                    .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl[3].required.
                    super__Vector_base<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>,_std::allocator<std::unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>_>_>
            + 8);
  tok = pTVar1;
  bVar2 = isTokenTypeOperator(pTVar1->type);
  if (bVar2) {
    parseUnary(this);
    return (unique_ptr<pfederc::Expr,_std::default_delete<pfederc::Expr>_>)this;
  }
  switch(pTVar1->type) {
  case TOK_DIRECTIVE:
  case TOK_ENSURE:
    parseCapabilities(this);
    break;
  case TOK_ID:
  case TOK_INT8:
  case TOK_INT16:
  case TOK_INT32:
  case TOK_INT64:
  case TOK_UINT8:
  case TOK_UINT16:
  case TOK_UINT32:
  case TOK_UINT64:
  case TOK_FLT32:
  case TOK_FLT64:
  case TOK_CHAR:
  case TOK_STR:
  case TOK_KW_TRUE:
  case TOK_KW_FALSE:
    Lexer::next((Lexer *)(caps->_M_t).
                         super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
                         .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
    std::make_unique<pfederc::TokenExpr,pfederc::Lexer&,pfederc::Token*const&>
              ((Lexer *)local_30,
               (Token **)
               (caps->_M_t).
               super___uniq_ptr_impl<pfederc::Capabilities,_std::default_delete<pfederc::Capabilities>_>
               ._M_t.
               super__Tuple_impl<0UL,_pfederc::Capabilities_*,_std::default_delete<pfederc::Capabilities>_>
               .super__Head_base<0UL,_pfederc::Capabilities_*,_false>._M_head_impl);
    this->lexer = (Lexer *)local_30;
    break;
  default:
    this->lexer = (Lexer *)0x0;
    break;
  case TOK_KW_FN:
    parseFunction(this,caps);
    break;
  case TOK_KW_LAMBDA:
    parseLambda(this);
    break;
  case TOK_KW_MOD:
    parseModule(this);
    break;
  case TOK_KW_CLASS:
    parseClass(this,caps);
    break;
  case TOK_KW_ENUM:
    parseEnum(this);
    break;
  case TOK_KW_TRAIT:
    parseTrait(this,caps);
    break;
  case TOK_KW_TYPE:
    parseType(this,caps);
    break;
  case TOK_KW_USE:
    parseUse(this);
    break;
  case TOK_KW_IF:
    goto LAB_0010c860;
  case TOK_KW_ENSURE:
LAB_0010c860:
    parseIf(this,SUB81(caps,0));
    break;
  case TOK_KW_MATCH:
    parseMatch(this);
    break;
  case TOK_KW_FOR:
    goto LAB_0010c7e1;
  case TOK_KW_DO:
LAB_0010c7e1:
    parseFor(this,SUB81(caps,0));
    break;
  case TOK_KW_SAFE:
    parseSafe(this);
  }
  return (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)
         (__uniq_ptr_data<pfederc::Expr,_std::default_delete<pfederc::Expr>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Expr> Parser::parsePrimary(std::unique_ptr<Capabilities> &&caps) noexcept {
  Token *const tok = lexer.getCurrentToken();
  if (isTokenTypeOperator(tok->getType()))
    return parseUnary();

  switch (tok->getType()) {
  case TokenType::TOK_ID:
  case TokenType::TOK_INT8:
  case TokenType::TOK_INT16:
  case TokenType::TOK_INT32:
  case TokenType::TOK_INT64:
  case TokenType::TOK_UINT8:
  case TokenType::TOK_UINT16:
  case TokenType::TOK_UINT32:
  case TokenType::TOK_UINT64:
  case TokenType::TOK_FLT32:
  case TokenType::TOK_FLT64:
  case TokenType::TOK_CHAR:
  case TokenType::TOK_STR:
  case TokenType::TOK_KW_TRUE:
  case TokenType::TOK_KW_FALSE:
    lexer.next();
    return std::make_unique<TokenExpr>(lexer, tok);
  case TokenType::TOK_KW_FN:
    return parseFunction(std::move(caps));
  case TokenType::TOK_KW_LAMBDA:
    return parseLambda();
  case TokenType::TOK_KW_MOD:
    return parseModule();
  case TokenType::TOK_KW_CLASS:
    return parseClass(std::move(caps));
  case TokenType::TOK_KW_ENUM:
    return parseEnum();
  case TokenType::TOK_KW_TRAIT:
    return parseTrait(std::move(caps));
  case TokenType::TOK_KW_TYPE:
    return parseType(std::move(caps));
  case TokenType::TOK_KW_USE:
    return parseUse();
  case TokenType::TOK_KW_IF:
    return parseIf();
  case TokenType::TOK_KW_ENSURE:
    return parseIf(true);
  case TokenType::TOK_KW_MATCH:
    return parseMatch();
  case TokenType::TOK_KW_FOR:
    return parseFor();
  case TokenType::TOK_KW_DO:
    return parseFor(true);
  case TokenType::TOK_KW_SAFE:
    return parseSafe();

// capabilties
  case TokenType::TOK_ENSURE:
    return parseCapabilities();
  case TokenType::TOK_DIRECTIVE:
    return parseCapabilities();
  default:
    return nullptr;
  }
}